

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_memorydata_binaryop(NetOptimize *this)

{
  uint uVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  Layer *pLVar8;
  bool bVar9;
  undefined4 uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_58;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar17 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_58 = 1;
  for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
    bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"MemoryData");
    if (!bVar9) {
      iVar11 = *((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar14]->tops).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (uVar18 = local_58; uVar18 < uVar17; uVar18 = uVar18 + 1) {
        bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar18]->type,"BinaryOp");
        if (((!bVar9) &&
            (pLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar18],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar4 == 8)) && ((*piVar4 == iVar11 || (piVar4[1] == iVar11)))) {
          if (uVar17 == uVar18) break;
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[uVar14];
          if (((*(int *)&pLVar3[1]._vptr_Layer != 1) ||
              (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) != 0)) ||
             (iVar15._0_1_ = pLVar3[1].one_blob_only, iVar15._1_1_ = pLVar3[1].support_inplace,
             iVar15._2_1_ = pLVar3[1].support_vulkan, iVar15._3_1_ = pLVar3[1].support_packing,
             iVar15 != 0)) break;
          pLVar6 = ppLVar5[uVar18];
          iVar15 = 1;
          if (*(pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start == iVar11) {
            uVar1 = *(uint *)&pLVar6[1]._vptr_Layer;
            if (5 < uVar1) break;
            if ((0x35U >> (uVar1 & 0x1f) & 1) == 0) {
              uVar10 = 7;
              if (uVar1 != 1) {
                uVar10 = 8;
              }
              *(undefined4 *)&pLVar6[1]._vptr_Layer = uVar10;
            }
            iVar15 = 0;
          }
          uVar10 = **(undefined4 **)&pLVar3[1].support_tensor_storage;
          *(undefined4 *)((long)&pLVar6[1]._vptr_Layer + 4) = 1;
          pLVar6[1].one_blob_only = (bool)(char)uVar10;
          pLVar6[1].support_inplace = (bool)(char)((uint)uVar10 >> 8);
          pLVar6[1].support_vulkan = (bool)(char)((uint)uVar10 >> 0x10);
          pLVar6[1].support_packing = (bool)(char)((uint)uVar10 >> 0x18);
          fprintf(_stderr,"fuse_memorydata_binaryop %s %s\n",(pLVar3->name)._M_dataplus._M_p,
                  (pLVar6->name)._M_dataplus._M_p);
          std::vector<int,_std::allocator<int>_>::erase
                    (&pLVar6->bottoms,
                     (int *)((ulong)(uint)(iVar15 << 2) +
                            *(long *)&(pLVar6->bottoms).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data));
          std::__cxx11::string::assign((char *)&pLVar3->type);
          break;
        }
      }
    }
    local_58 = local_58 + 1;
  }
  uVar14 = 0;
LAB_00146c89:
  if (uVar17 <= uVar14) {
    return 0;
  }
  bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"MemoryData");
  if (!bVar9) {
    iVar11 = *((((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14]->tops).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    for (uVar18 = uVar14 + 2; uVar18 - 1 < uVar17; uVar18 = uVar18 + 1) {
      bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar18 - 1]->type,"Split");
      if (((!bVar9) &&
          (pLVar3 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar18 - 1],
          piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          (long)*(pointer *)
                 ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                 ) - (long)piVar4 == 4)) && (*piVar4 == iVar11)) {
        uVar16 = uVar18;
        if ((1 - uVar17) + uVar18 != 2) goto LAB_00146d2d;
        break;
      }
    }
  }
  goto LAB_00146f1c;
LAB_00146d2d:
  for (; uVar16 < uVar17; uVar16 = uVar16 + 1) {
    bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar16]->type,"BinaryOp");
    if (!bVar9) {
      ppLVar5 = (((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pLVar3 = ppLVar5[uVar16];
      piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)*(pointer *)
                 ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                 ) - (long)piVar4 == 8) {
        pLVar3 = ppLVar5[uVar18 - 1];
        lVar7 = *(long *)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        uVar12 = (ulong)((long)*(pointer *)
                                ((long)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl + 8) - lVar7) >> 2;
        uVar13 = uVar12 & 0xffffffff;
        if ((int)uVar12 < 1) {
          uVar13 = 0;
        }
        for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
          iVar11 = *(int *)(lVar7 + uVar12 * 4);
          if ((*piVar4 == iVar11) || (piVar4[1] == iVar11)) goto LAB_00146dbe;
        }
      }
    }
  }
  uVar12 = 0xffffffffffffffff;
LAB_00146dbe:
  if (uVar16 != uVar17) {
    ppLVar5 = (((this->super_ModelWriter).layers)->
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pLVar3 = ppLVar5[uVar14];
    if (((*(int *)&pLVar3[1]._vptr_Layer == 1) && (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0))
       && (iVar11._0_1_ = pLVar3[1].one_blob_only, iVar11._1_1_ = pLVar3[1].support_inplace,
          iVar11._2_1_ = pLVar3[1].support_vulkan, iVar11._3_1_ = pLVar3[1].support_packing,
          iVar11 == 0)) {
      pLVar6 = ppLVar5[uVar18 - 1];
      pLVar8 = ppLVar5[uVar16];
      iVar11 = 1;
      if (*(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
          *(int *)(*(long *)&(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + uVar12 * 4)) {
        uVar1 = *(uint *)&pLVar8[1]._vptr_Layer;
        if (5 < uVar1) goto LAB_00146f1c;
        if ((0x35U >> (uVar1 & 0x1f) & 1) == 0) {
          uVar10 = 7;
          if (uVar1 != 1) {
            uVar10 = 8;
          }
          *(undefined4 *)&pLVar8[1]._vptr_Layer = uVar10;
        }
        iVar11 = 0;
      }
      uVar10 = **(undefined4 **)&pLVar3[1].support_tensor_storage;
      *(undefined4 *)((long)&pLVar8[1]._vptr_Layer + 4) = 1;
      pLVar8[1].one_blob_only = (bool)(char)uVar10;
      pLVar8[1].support_inplace = (bool)(char)((uint)uVar10 >> 8);
      pLVar8[1].support_vulkan = (bool)(char)((uint)uVar10 >> 0x10);
      pLVar8[1].support_packing = (bool)(char)((uint)uVar10 >> 0x18);
      fprintf(_stderr,"fuse_memorydata_binaryop %s %s\n",(pLVar3->name)._M_dataplus._M_p,
              (pLVar8->name)._M_dataplus._M_p);
      std::vector<int,_std::allocator<int>_>::erase
                (&pLVar8->bottoms,
                 (int *)((ulong)(uint)(iVar11 << 2) +
                        *(long *)&(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data));
      std::vector<int,_std::allocator<int>_>::erase
                (&pLVar6->tops,
                 (int *)(uVar12 * 4 +
                        *(long *)&(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data));
      if ((pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          *(pointer *)
           ((long)&(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
        std::__cxx11::string::assign((char *)&pLVar6->type);
        std::__cxx11::string::assign((char *)&pLVar3->type);
      }
      uVar14 = uVar14 - 1;
    }
  }
LAB_00146f1c:
  uVar14 = uVar14 + 1;
  goto LAB_00146c89;
}

Assistant:

int NetOptimize::fuse_memorydata_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse MemoryData - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == top_blob_index)
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        memorydata->type = "ncnnfused";
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - Split - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j0 = i + 1;
        for (; j0 < layer_count; j0++)
        {
            if (layers[j0]->type != "Split")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (layers[j0]->bottoms[0] == top_blob_index)
                break;
        }

        if (j0 == layer_count)
            continue;

        int split_top_blob_index = -1;

        size_t j1 = j0 + 1;
        for (; j1 < layer_count; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 2)
                continue;

            for (int k = 0; k < (int)layers[j0]->tops.size(); k++)
            {
                if (layers[j1]->bottoms[0] == layers[j0]->tops[k] || layers[j1]->bottoms[1] == layers[j0]->tops[k])
                {
                    split_top_blob_index = k;
                    break;
                }
            }

            if (split_top_blob_index != -1)
                break;
        }

        if (j1 == layer_count)
            continue;

        // fuse MemoryData - Split - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::Split* split = (ncnn::Split*)layers[j0];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j1];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == split->tops[split_top_blob_index])
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        split->tops.erase(split->tops.begin() + split_top_blob_index);
        if (split->tops.empty())
        {
            split->type = "ncnnfused";
            memorydata->type = "ncnnfused";
        }

        i--;
    }

    return 0;
}